

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_Alloc.cpp
# Opt level: O1

void * crnlib::MyAlloc(size_t size)

{
  void *pvVar1;
  
  if (size == 0) {
    return (void *)0x0;
  }
  pvVar1 = crnlib_malloc(size,(size_t *)0x0);
  return pvVar1;
}

Assistant:

void* MyAlloc(size_t size) {
  if (size == 0)
    return 0;
#ifdef _SZ_ALLOC_DEBUG
  {
    void* p = crnlib::crnlib_malloc(size);
    fprintf(stderr, "\nAlloc %10d bytes, count = %10d,  addr = %8X", size, g_allocCount++, (unsigned)p);
    return p;
  }
#else
  return crnlib::crnlib_malloc(size);
#endif
}